

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_set_hostname(mbedtls_ssl_context *ssl,char *hostname)

{
  size_t len;
  char *pcVar1;
  size_t local_28;
  size_t hostname_len;
  char *hostname_local;
  mbedtls_ssl_context *ssl_local;
  
  local_28 = 0;
  if ((hostname == (char *)0x0) || (local_28 = strlen(hostname), local_28 < 0x100)) {
    if (ssl->hostname != (char *)0x0) {
      pcVar1 = ssl->hostname;
      len = strlen(ssl->hostname);
      mbedtls_zeroize_and_free(pcVar1,len);
    }
    if (hostname == (char *)0x0) {
      ssl->hostname = (char *)0x0;
    }
    else {
      pcVar1 = (char *)calloc(1,local_28 + 1);
      ssl->hostname = pcVar1;
      if (ssl->hostname == (char *)0x0) {
        return -0x7f00;
      }
      memcpy(ssl->hostname,hostname,local_28);
      ssl->hostname[local_28] = '\0';
    }
    ssl_local._4_4_ = 0;
  }
  else {
    ssl_local._4_4_ = -0x7100;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_hostname(mbedtls_ssl_context *ssl, const char *hostname)
{
    /* Initialize to suppress unnecessary compiler warning */
    size_t hostname_len = 0;

    /* Check if new hostname is valid before
     * making any change to current one */
    if (hostname != NULL) {
        hostname_len = strlen(hostname);

        if (hostname_len > MBEDTLS_SSL_MAX_HOST_NAME_LEN) {
            return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
        }
    }

    /* Now it's clear that we will overwrite the old hostname,
     * so we can free it safely */

    if (ssl->hostname != NULL) {
        mbedtls_zeroize_and_free(ssl->hostname, strlen(ssl->hostname));
    }

    /* Passing NULL as hostname shall clear the old one */

    if (hostname == NULL) {
        ssl->hostname = NULL;
    } else {
        ssl->hostname = mbedtls_calloc(1, hostname_len + 1);
        if (ssl->hostname == NULL) {
            return MBEDTLS_ERR_SSL_ALLOC_FAILED;
        }

        memcpy(ssl->hostname, hostname, hostname_len);

        ssl->hostname[hostname_len] = '\0';
    }

    return 0;
}